

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall
QColumnViewPrivate::checkColumnCreation(QColumnViewPrivate *this,QModelIndex *parent)

{
  long lVar1;
  QAbstractItemModel *pQVar2;
  QAbstractItemView *pQVar3;
  bool bVar4;
  QModelIndex *rhs;
  qsizetype qVar5;
  const_reference ppQVar6;
  undefined8 in_RSI;
  QColumnViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemView *view;
  int i;
  bool in_stack_000000d7;
  QModelIndex *in_stack_000000d8;
  QColumnViewPrivate *in_stack_000000e0;
  QModelIndex *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  byte bVar7;
  int local_4c;
  QColumnViewPrivate *pQVar8;
  QModelIndex *in_stack_ffffffffffffffc8;
  QColumnViewPrivate *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = in_RDI;
  q_func(in_RDI);
  QAbstractItemView::currentIndex
            ((QAbstractItemView *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  bVar4 = ::operator==((QModelIndex *)in_RDI,in_stack_ffffffffffffff88);
  bVar7 = 0;
  if (bVar4) {
    pQVar2 = (in_RDI->super_QAbstractItemViewPrivate).model;
    bVar7 = (**(code **)(*(long *)pQVar2 + 0x88))(pQVar2,in_RSI);
  }
  if ((bVar7 & 1) != 0) {
    local_4c = 0;
    while( true ) {
      rhs = (QModelIndex *)(long)local_4c;
      qVar5 = QList<QAbstractItemView_*>::size(&in_RDI->columns);
      if (qVar5 <= (long)rhs) break;
      ppQVar6 = QList<QAbstractItemView_*>::at((QList<QAbstractItemView_*> *)in_RDI,(qsizetype)rhs);
      pQVar3 = *ppQVar6;
      QAbstractItemView::rootIndex((QAbstractItemView *)in_RDI);
      bVar4 = ::operator==((QModelIndex *)in_RDI,rhs);
      if (bVar4) {
        if (pQVar3 == in_RDI->previewColumn) {
          closeColumns(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                       SUB81((ulong)pQVar8 >> 0x38,0));
          createColumn(in_stack_000000e0,in_stack_000000d8,in_stack_000000d7);
        }
        break;
      }
      local_4c = local_4c + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColumnViewPrivate::checkColumnCreation(const QModelIndex &parent)
{
    if (parent == q_func()->currentIndex() && model->hasChildren(parent)) {
        //the parent has children and is the current
        //let's try to find out if there is already a mapping that is good
        for (int i = 0; i < columns.size(); ++i) {
            QAbstractItemView *view = columns.at(i);
            if (view->rootIndex() == parent) {
                if (view == previewColumn) {
                    //let's recreate the parent
                    closeColumns(parent, false);
                    createColumn(parent, true /*show*/);
                }
                break;
            }
        }
    }
}